

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_printf_http_chunk(mg_connection *nc,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined1 local_b8 [8];
  va_list ap;
  char **ppcStack_90;
  int len;
  char *buf;
  char mem [100];
  char *fmt_local;
  mg_connection *nc_local;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  ppcStack_90 = &buf;
  ap[0].overflow_arg_area = local_168;
  ap[0]._0_8_ = &stack0x00000008;
  local_b8._4_4_ = 0x30;
  local_b8._0_4_ = 0x10;
  local_158 = in_RDX;
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  iVar1 = mg_avprintf((char **)&stack0xffffffffffffff70,100,fmt,(__va_list_tag *)local_b8);
  if (-1 < iVar1) {
    mg_send_http_chunk(nc,(char *)ppcStack_90,(long)iVar1);
  }
  if ((ppcStack_90 != &buf) && (ppcStack_90 != (char **)0x0)) {
    free(ppcStack_90);
  }
  return;
}

Assistant:

void mg_printf_http_chunk(struct mg_connection *nc, const char *fmt, ...) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int len;
    va_list ap;

    va_start(ap, fmt);
    len = mg_avprintf(&buf, sizeof(mem), fmt, ap);
    va_end(ap);

    if (len >= 0) {
        mg_send_http_chunk(nc, buf, len);
    }

    /* LCOV_EXCL_START */
    if (buf != mem && buf != NULL) {
        MG_FREE(buf);
    }
    /* LCOV_EXCL_STOP */
}